

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O1

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,Scene *scene,SetMB *set)

{
  uint uVar1;
  uint uVar2;
  PrimRefMB *pPVar3;
  Geometry *pGVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  float fVar25;
  float fVar26;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  float fVar27;
  vfloat4 a;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  Vec3fa axis1;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar12 = (set->super_PrimInfoMB).object_range._begin;
  if (uVar12 < (set->super_PrimInfoMB).object_range._end) {
    lVar10 = uVar12 * 0x50 + 0x1c;
    local_68 = 0;
    uStack_60 = 0x3f800000;
    uVar11 = 0xffffffffffffffff;
    do {
      pPVar3 = set->prims->items;
      uVar1 = *(uint *)((long)pPVar3 + lVar10 + -0x10);
      uVar2 = *(uint *)((long)&(pPVar3->lbounds).bounds0.lower.field_0 + lVar10);
      uVar13 = CONCAT44(uVar2,uVar1);
      if (uVar13 < uVar11) {
        pGVar4 = (scene->geometries).items[uVar1].ptr;
        fVar17 = (pGVar4->time_range).lower;
        fVar19 = pGVar4->fnumTimeSegments;
        fVar15 = (set->super_PrimInfoMB).time_range.upper;
        fVar18 = (pGVar4->time_range).upper - fVar17;
        fVar14 = floorf((((set->super_PrimInfoMB).time_range.lower - fVar17) / fVar18) * 1.0000002 *
                        fVar19);
        fVar16 = 0.0;
        if (0.0 <= fVar14) {
          fVar16 = fVar14;
        }
        fVar15 = ceilf(((fVar15 - fVar17) / fVar18) * 0.99999976 * fVar19);
        if (fVar19 <= fVar15) {
          fVar15 = fVar19;
        }
        if ((int)fVar15 != (int)fVar16) {
          (*(pGVar4->super_RefCount)._vptr_RefCount[0x38])
                    (&local_48,pGVar4,(ulong)uVar2,(long)(((int)fVar15 + (int)fVar16) / 2));
          fVar17 = fStack_44 * fStack_44;
          fVar16 = fStack_40 * fStack_40;
          fVar14 = fStack_3c * fStack_3c;
          fVar19 = fVar17 + local_48 * local_48 + fVar16;
          fVar15 = fVar17 + fVar17 + fVar14;
          fVar16 = fVar17 + fVar16 + fVar16;
          fVar14 = fVar17 + fVar14 + fVar14;
          if (1e-18 < fVar19) {
            auVar20._4_4_ = fVar15;
            auVar20._0_4_ = fVar19;
            auVar20._8_4_ = fVar16;
            auVar20._12_4_ = fVar14;
            auVar29._4_4_ = fVar15;
            auVar29._0_4_ = fVar19;
            auVar29._8_4_ = fVar16;
            auVar29._12_4_ = fVar14;
            auVar29 = rsqrtss(auVar20,auVar29);
            fVar15 = auVar29._0_4_;
            fVar19 = fVar15 * fVar15 * fVar19 * -0.5 * fVar15 + fVar15 * 1.5;
            local_68 = CONCAT44(fStack_44 * fVar19,local_48 * fVar19);
            uStack_60 = CONCAT44(fStack_3c * fVar19,fStack_40 * fVar19);
            uVar11 = uVar13;
          }
        }
      }
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x50;
    } while (uVar12 < (set->super_PrimInfoMB).object_range._end);
  }
  else {
    local_68 = 0;
    uStack_60 = 0x3f800000;
  }
  fVar19 = -local_68._4_4_;
  fVar15 = -(float)uStack_60;
  auVar21._8_4_ = 0xffffffff;
  auVar21._0_8_ = 0xffffffffffffffff;
  if (fVar19 * fVar19 + (float)uStack_60 * (float)uStack_60 + 0.0 <=
      (float)local_68 * (float)local_68 + fVar15 * fVar15 + 0.0) {
    auVar21 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar22._0_4_ = ~auVar21._0_4_ & (uint)fVar15;
  auVar22._4_4_ = 0;
  auVar22._8_4_ = ~auVar21._8_4_ & (uint)(float)local_68;
  auVar9._4_4_ = (uint)fVar19 & auVar21._8_4_;
  auVar9._0_4_ = (uint)(float)uStack_60 & auVar21._4_4_;
  auVar9._8_4_ = 0;
  auVar22 = auVar22 | auVar9 << 0x20;
  fVar15 = auVar22._0_4_;
  fVar16 = auVar22._4_4_;
  fVar17 = auVar22._8_4_;
  fVar19 = fVar16 * fVar16;
  fVar14 = fVar17 * fVar17;
  fVar18 = fVar19 + fVar15 * fVar15 + fVar14;
  fVar27 = fVar19 + fVar19 + 0.0;
  fVar14 = fVar19 + fVar14 + fVar14;
  fVar19 = fVar19 + 0.0 + 0.0;
  auVar28._4_4_ = fVar27;
  auVar28._0_4_ = fVar18;
  auVar28._8_4_ = fVar14;
  auVar28._12_4_ = fVar19;
  auVar7._4_4_ = fVar27;
  auVar7._0_4_ = fVar18;
  auVar7._8_4_ = fVar14;
  auVar7._12_4_ = fVar19;
  auVar29 = rsqrtss(auVar28,auVar7);
  fVar19 = auVar29._0_4_;
  fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar18 * 0.5 * fVar19;
  fVar15 = fVar19 * fVar15;
  fVar16 = fVar19 * fVar16;
  fVar17 = fVar19 * fVar17;
  fVar14 = fVar16 * (float)local_68 - local_68._4_4_ * fVar15;
  fVar18 = fVar17 * local_68._4_4_ - (float)uStack_60 * fVar16;
  fVar27 = fVar15 * (float)uStack_60 - (float)local_68 * fVar17;
  fVar26 = fVar19 * 0.0 * uStack_60._4_4_ - uStack_60._4_4_ * fVar19 * 0.0;
  fVar19 = fVar18 * fVar18;
  fVar25 = fVar27 * fVar27;
  fVar26 = fVar26 * fVar26;
  fVar30 = fVar25 + fVar19 + fVar14 * fVar14;
  fVar31 = fVar26 + fVar19 + fVar19;
  fVar25 = fVar25 + fVar19 + fVar25;
  fVar26 = fVar26 + fVar19 + fVar26;
  auVar23._4_4_ = fVar31;
  auVar23._0_4_ = fVar30;
  auVar23._8_4_ = fVar25;
  auVar23._12_4_ = fVar26;
  auVar8._4_4_ = fVar31;
  auVar8._0_4_ = fVar30;
  auVar8._8_4_ = fVar25;
  auVar8._12_4_ = fVar26;
  auVar29 = rsqrtss(auVar23,auVar8);
  fVar19 = auVar29._0_4_;
  fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar30 * 0.5 * fVar19;
  aVar24.m128[1] = fVar19 * fVar27;
  aVar24.m128[0] = fVar16;
  aVar24.m128[2] = local_68._4_4_;
  aVar24.m128[3] = 0.0;
  aVar5.m128[1] = fVar19 * fVar18;
  aVar5.m128[0] = fVar15;
  aVar5.m128[2] = (float)local_68;
  aVar5.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar5;
  (__return_storage_ptr__->vy).field_0 = aVar24;
  aVar6.m128[1] = fVar19 * fVar14;
  aVar6.m128[0] = fVar17;
  aVar6.m128[2] = (float)uStack_60;
  aVar6.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar6;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpaceMB(Scene* scene, const SetMB& set)
        {
          Vec3fa axis0(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const PrimRefMB& prim = (*set.prims)[i];
            const unsigned int geomID = prim.geomID();
            const unsigned int primID = prim.primID();
            const uint64_t geomprimID = prim.ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            
            const Geometry* mesh = scene->get(geomID);
            const range<int> tbounds = mesh->timeSegmentRange(set.time_range);
            if (tbounds.size() == 0) continue;

            const size_t t = (tbounds.begin()+tbounds.end())/2;
            const Vec3fa axis1 = mesh->computeDirection(primID,t);
            if (sqr_length(axis1) > 1E-18f) {
              axis0 = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }

          return frame(axis0).transposed();
        }